

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.cpp
# Opt level: O2

vm_obj_id_t CVmObjTads::create_from_stack_multi(uint argc,int is_transient)

{
  vm_datatype_t *pvVar1;
  vm_val_t *pvVar2;
  vm_obj_id_t obj_id;
  uint uVar3;
  int iVar4;
  CVmObjTads *this;
  char *lst;
  ushort *lst_00;
  ushort uVar5;
  uint uVar6;
  uint uVar7;
  uint argc_00;
  vm_val_t *this_00;
  uint j;
  vm_rcdesc rc;
  vm_val_t new_obj_val;
  vm_val_t sc_1;
  
  obj_id = vm_new_id(0,1,0);
  if (is_transient != 0) {
    *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 =
         *(ushort *)&G_obj_table_X.pages_[obj_id >> 0xc][obj_id & 0xfff].field_0x14 | 0x80;
  }
  this = (CVmObjTads *)CVmObject::operator_new(0x10,obj_id);
  CVmObjTads(this,(ushort)argc,0x10);
  pvVar2 = sp_;
  pvVar1 = &sp_->typ;
  sp_ = sp_ + 1;
  *pvVar1 = VM_OBJ;
  (pvVar2->val).obj = obj_id;
  uVar7 = 0;
  while( true ) {
    pvVar2 = sp_;
    uVar6 = uVar7 & 0xffff;
    if (argc <= uVar6) {
      rc.name = "TadsObject.contructMulti";
      rc.bifptr.typ = VM_NIL;
      rc.method_idx = 0;
      rc._8_8_ = rc._8_8_ & 0xffffffff00000000;
      rc.argp = (vm_val_t *)0x0;
      rc.caller_addr = (uchar *)0x0;
      uVar5 = 0;
      rc.self.typ = rc.bifptr.typ;
      do {
        if ((ushort)argc <= uVar5) {
          sp_ = sp_ + (-1 - (ulong)argc);
          return obj_id;
        }
        lst_00 = (ushort *)vm_val_t::get_as_list(sp_ + (~(ulong)uVar5 - 1));
        if (lst_00 != (ushort *)0x0) {
          CVmObjList::index_list(&sc_1,(char *)lst_00,1);
          uVar7 = (uint)*lst_00;
          argc_00 = *lst_00 - 1;
          iVar4 = CVmStack::check_space(&G_interpreter_X.super_CVmStack,argc_00);
          if (iVar4 == 0) {
            err_throw(0x8ff);
          }
          for (; 1 < uVar7; uVar7 = uVar7 - 1) {
            CVmObjList::index_and_push((char *)lst_00,uVar7);
          }
          new_obj_val.typ = VM_OBJ;
          new_obj_val.val.obj = obj_id;
          CVmRun::get_prop(&G_interpreter_X,0,&sc_1,G_predef_X.obj_construct,&new_obj_val,argc_00,
                           &rc);
        }
        uVar5 = uVar5 + 1;
      } while( true );
    }
    uVar3 = uVar6 * 0x10 + 0x10;
    this_00 = (vm_val_t *)((long)sp_ + (-0x10 - (ulong)uVar3));
    lst = vm_val_t::get_as_list(this_00);
    if (lst == (char *)0x0) {
      rc.argp = *(vm_val_t **)this_00;
      rc._8_8_ = *(undefined8 *)((long)pvVar2 + (-8 - (ulong)uVar3));
    }
    else {
      CVmObjList::index_list((vm_val_t *)&rc,lst,1);
    }
    if ((int)rc.argp != 5) break;
    iVar4 = is_tadsobj_obj(rc.argc);
    if (iVar4 == 0) break;
    iVar4 = CVmObjTable::is_obj_transient(&G_obj_table_X,rc.argc);
    if (iVar4 != 0) {
      err_throw(0x7e1);
    }
    set_sc(this,(ushort)uVar7,rc.argc);
    uVar7 = uVar6 + 1;
  }
  err_throw(0x900);
}

Assistant:

vm_obj_id_t CVmObjTads::create_from_stack_multi(
    VMG_ uint argc, int is_transient)
{
    /* allocate an object ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, TRUE, FALSE);
    if (is_transient)
        G_obj_table->set_obj_transient(id);

    /* create the new object */
    CVmObjTads *obj = new (vmg_ id) CVmObjTads(
        vmg_ (ushort)argc, VMTOBJ_PROP_INIT);

    /* push the new object, for garbage collector protection */
    G_interpreter->push_obj(vmg_ id);

    /* set the superclasses */
    for (ushort i = 0 ; i < argc ; ++i)
    {
        /* 
         *   get this argument (it's at i+1 because of the extra item we
         *   pushed for gc protection) 
         */
        vm_val_t *arg = G_stk->get(i + 1);

        /* 
         *   if it's a list, the superclass is the first element; otherwise,
         *   the argument is the superclass 
         */
        vm_val_t sc;
        const char *lstp = arg->get_as_list(vmg0_);
        if (lstp != 0)
        {
            /* it's a list - the first element is the superclass */
            CVmObjList::index_list(vmg_ &sc, lstp, 1);
        }
        else
        {
            /* not a list - the argument is the superclass */
            sc = *arg;
        }

        /* make sure it's a TadsObject */
        if (sc.typ != VM_OBJ || !is_tadsobj_obj(vmg_ sc.val.obj))
            err_throw(VMERR_BAD_TYPE_BIF);

        /* can't create an instance of a transient object */
        if (G_obj_table->is_obj_transient(sc.val.obj))
            err_throw(VMERR_BAD_DYNAMIC_NEW);

        /* set this superclass */
        obj->set_sc(vmg_ i, sc.val.obj);
    }

    /* set up the resursive invocation context */
    vm_rcdesc rc("TadsObject.contructMulti");

    /*
     *   The new object is ready to go.  All that remains is invoking any
     *   inherited construtors that the caller wants us to invoked.
     *   Constructor invocation is indicated by passing a list argument for
     *   the corresponding superclass, so run through the arguments and
     *   invoke each indicated constructor.  
     */
    for (ushort i = 0 ; i < argc ; ++i)
    {    
        /* get the next argument */
        vm_val_t *arg = G_stk->get(i + 1);

        /* if it's not a list, we don't want to invoke this constructor */
        const char *lstp = arg->get_as_list(vmg0_);
        if (lstp == 0)
        {
            /* no constructor call is wanted - just keep going */
            continue;
        }

        /* get the superclass from the list */
        vm_val_t sc;
        CVmObjList::index_list(vmg_ &sc, lstp, 1);

        /* get the number of list elements */
        uint lst_cnt = vmb_get_len(lstp);

        /* make sure we have room to push the arguments */
        if (!G_stk->check_space(lst_cnt - 1))
            err_throw(VMERR_STACK_OVERFLOW);

        /* 
         *   push the list elements in reverse order; don't push the first
         *   element, since it's the superclass itself rather than an
         *   argument to the constructor 
         */
        for (uint j = lst_cnt ; j > 1 ; --j)
            CVmObjList::index_and_push(vmg_ lstp, j);

        /* 
         *   Invoke the constructor via a recursive call into the VM.  Note
         *   that we're inheriting the property, so 'self' is the new object,
         *   but the 'target' object is the superclass whose constructor
         *   we're invoking. 
         */
        vm_val_t new_obj_val;
        new_obj_val.set_obj(id);
        G_interpreter->get_prop(vmg_ 0, &sc, G_predef->obj_construct,
                                &new_obj_val, lst_cnt - 1, &rc);
    }

    /* discard the arguments plus our own gc protection */
    G_stk->discard(argc + 1);

    /* return the new object */
    return id;
}